

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matroskaParser.cpp
# Opt level: O0

void __thiscall
ParsedLPCMTrackData::ParsedLPCMTrackData(ParsedLPCMTrackData *this,MatroskaTrack *track)

{
  char *__s;
  bool bVar1;
  uint8_t *puVar2;
  MatroskaAudioTrack *audiotrack;
  string local_70;
  allocator<char> local_49;
  string local_48;
  MatroskaTrack *local_18;
  MatroskaTrack *track_local;
  ParsedLPCMTrackData *this_local;
  
  local_18 = track;
  track_local = (MatroskaTrack *)this;
  ParsedTrackPrivData::ParsedTrackPrivData
            (&this->super_ParsedTrackPrivData,track->codec_priv,track->codec_priv_size);
  (this->super_ParsedTrackPrivData)._vptr_ParsedTrackPrivData =
       (_func_int **)&PTR__ParsedLPCMTrackData_004413f8;
  MemoryBlock::MemoryBlock(&this->m_waveBuffer);
  __s = local_18->codec_id;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,__s,&local_49);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,"/BIG",(allocator<char> *)((long)&audiotrack + 7));
  bVar1 = strEndWith(&local_48,&local_70);
  this->m_convertBytes = bVar1;
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator((allocator<char> *)((long)&audiotrack + 7));
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator(&local_49);
  this->m_channels = *(uint16_t *)&local_18->field_0x84;
  this->m_bitdepth = *(uint16_t *)&local_18->field_0x86;
  wave_format::buildWaveHeader
            (&this->m_waveBuffer,*(int *)&local_18[1].field_0x4,this->m_channels,
             5 < this->m_channels,this->m_bitdepth);
  if (local_18->codec_priv_size == 0x28) {
    puVar2 = MemoryBlock::data(&this->m_waveBuffer);
    memcpy(puVar2 + 0x14,local_18->codec_priv,(long)local_18->codec_priv_size);
  }
  return;
}

Assistant:

ParsedLPCMTrackData::ParsedLPCMTrackData(MatroskaTrack* track)
    : ParsedTrackPrivData(track->codec_priv, track->codec_priv_size)
{
    m_convertBytes = strEndWith(track->codec_id, "/BIG");
    const auto audiotrack = reinterpret_cast<MatroskaAudioTrack*>(track);
    m_channels = audiotrack->channels;
    m_bitdepth = audiotrack->bitdepth;

    buildWaveHeader(m_waveBuffer, audiotrack->samplerate, m_channels, m_channels >= 6, m_bitdepth);

    if (track->codec_priv_size == sizeof(WAVEFORMATPCMEX))
        memcpy(m_waveBuffer.data() + 20, track->codec_priv, track->codec_priv_size);
}